

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert *self,int new_size,ImDrawVert v)

{
  ImVec2 *pIVar1;
  int iVar2;
  ImDrawVert *pIVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar2 = self->Capacity;
  if (iVar2 < new_size) {
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar6 <= new_size) {
      iVar6 = new_size;
    }
    if (iVar2 < iVar6) {
      pIVar3 = (ImDrawVert *)ImGui::MemAlloc((long)iVar6 * 0x14);
      if (self->Data != (ImDrawVert *)0x0) {
        memcpy(pIVar3,self->Data,(long)self->Size * 0x14);
        ImGui::MemFree(self->Data);
      }
      self->Data = pIVar3;
      self->Capacity = iVar6;
    }
  }
  iVar2 = self->Size;
  if (iVar2 < new_size) {
    lVar4 = (long)new_size - (long)iVar2;
    lVar5 = (long)iVar2 * 0x14;
    do {
      pIVar3 = self->Data;
      *(ImU32 *)((long)&pIVar3->col + lVar5) = v.col;
      pIVar1 = (ImVec2 *)((long)&(pIVar3->pos).x + lVar5);
      *pIVar1 = v.pos;
      pIVar1[1] = v.uv;
      lVar5 = lVar5 + 0x14;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawVert_resizeT(ImVector_ImDrawVert* self,int new_size,const ImDrawVert v)
{
    return self->resize(new_size,v);
}